

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::SubroutineFunctionSet::SubroutineFunctionSet
          (SubroutineFunctionSet *this,SubroutineFunctionSet *param_1)

{
  pointer pSVar1;
  long lVar2;
  pointer pSVar3;
  pointer this_00;
  
  lVar2 = (long)(param_1->fn).
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(param_1->fn).
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                ._M_impl.super__Vector_impl_data._M_start;
  std::
  _Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::_Vector_base((_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                  *)this,lVar2 / 0x108,(allocator_type *)(lVar2 % 0x108));
  pSVar1 = (param_1->fn).
           super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (this->fn).
            super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (pSVar3 = (param_1->fn).
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    SubroutineFunction::SubroutineFunction(this_00,pSVar3);
    this_00 = this_00 + 1;
  }
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_finish = this_00;
  std::__cxx11::string::string((string *)&this->typeName,(string *)&param_1->typeName);
  return;
}

Assistant:

SubroutineFunctionSet(UniformValueGenerator& generator, size_t count = 0) : fn(count, SubroutineFunction(generator))
	{
	}